

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stacktrace_libgcc-inl.h
# Opt level: O3

int GetStackFramesWithContext_libgcc
              (void **result,int *sizes,int max_depth,int skip_count,void *ucp)

{
  _Unwind_Backtrace(libgcc_backtrace_helper);
  memset(sizes,0,0);
  return 0;
}

Assistant:

static int GET_STACK_TRACE_OR_FRAMES {
  libgcc_backtrace_data data;
  data.array = result;
  // we're also skipping current and parent's frame
  data.skip = skip_count + 2;
  data.pos = 0;
  data.limit = max_depth;

  _Unwind_Backtrace(libgcc_backtrace_helper, &data);

  if (data.pos > 1 && data.array[data.pos - 1] == nullptr)
    --data.pos;

#if IS_STACK_FRAMES
  // No implementation for finding out the stack frame sizes.
  memset(sizes, 0, sizeof(*sizes) * data.pos);
#endif

  return data.pos;
}